

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O3

return_type * __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::and_then<____C_A_T_C_H____T_E_S_T____28()::__23&>
          (return_type *__return_storage_ptr__,
          impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
          *this,anon_class_1_0_00000001 *fn)

{
  undefined1 *puVar1;
  pointer pcVar2;
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar3;
  uint *puVar4;
  return_type *prVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_class_1_0_00000001 local_39;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  byte local_18;
  
  if (this[0x20] ==
      (impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
       )0x0) {
    puVar4 = (uint *)std::get<0ul,int,std::__cxx11::string>
                               ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this);
    if ((*puVar4 & 1) == 0) {
      *(int *)&(__return_storage_ptr__->
               super_strong_type_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_> = (int)*puVar4 >> 1;
      prVar5 = (return_type *)0x0;
    }
    else {
      puVar1 = (undefined1 *)
               ((long)&(__return_storage_ptr__->
                       super_strong_type_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ).
                       super_strong_type_payload<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._value.
                       super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
                       super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
                       super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_> + 0x10);
      *(undefined1 **)
       &(__return_storage_ptr__->
        super_strong_type_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ).
        super_strong_type_payload<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._value.
        super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
        super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
        super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_> = puVar1;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->
               super_strong_type_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_> + 0x10) = 0x73706f6f;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super_strong_type_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_> + 8) = 4;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->
               super_strong_type_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ).
               super_strong_type_payload<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               ._value.
               super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
               super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_> + 0x14) = 0;
      prVar5 = (return_type *)CONCAT71((int7)((ulong)puVar1 >> 8),1);
    }
    *(__index_type *)
     ((long)&(__return_storage_ptr__->
             super_strong_type_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ).
             super_strong_type_payload<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._value.
             super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
             super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
             super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_> + 0x20) =
         (__index_type)prVar5;
  }
  else {
    pvVar3 = std::get<1ul,int,std::__cxx11::string>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    local_38._0_8_ = (long)&local_38 + 0x10;
    pcVar2 = (pvVar3->_M_dataplus)._M_p;
    paVar6 = &pvVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar6) {
      local_38._16_8_ = paVar6->_M_allocated_capacity;
      local_38._24_8_ = *(undefined8 *)((long)&pvVar3->field_2 + 8);
    }
    else {
      local_38._16_8_ = paVar6->_M_allocated_capacity;
      local_38._0_8_ = pcVar2;
    }
    local_38._8_8_ = pvVar3->_M_string_length;
    (pvVar3->_M_dataplus)._M_p = (pointer)paVar6;
    pvVar3->_M_string_length = 0;
    (pvVar3->field_2)._M_local_buf[0] = '\0';
    local_18 = 1;
    std::__detail::__variant::
    _Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)__return_storage_ptr__,
                      (_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_38._M_first);
    prVar5 = (return_type *)
             (*std::__detail::__variant::
               __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
               ::_S_vtable._M_arr[local_18]._M_data)
                       (&local_39,
                        (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_38);
  }
  return prVar5;
}

Assistant:

constexpr decltype(auto) and_then(Fn&& fn) &&
      {
        return _impl::and_then(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }